

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::RestrainSide
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,int side,TPZInterpolatedElement *large,
          int neighbourside)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  REAL RVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  ostream *poVar13;
  TPZConnect *pTVar14;
  TPZGeoEl *pTVar15;
  TPZFNMatrix<1000,_double> *this_00;
  ulong uVar16;
  double *pdVar17;
  ulong uVar18;
  int64_t myindex;
  int64_t iVar19;
  TPZDepend *pTVar20;
  ulong uVar21;
  int iaxes;
  uint b;
  long lVar22;
  size_t lineN;
  int jn_2;
  int connect;
  ulong uVar23;
  int jn;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  int in;
  ulong uVar28;
  bool bVar29;
  double local_3c28;
  TPZAutoPointer<TPZMatrix<double>_> local_3bb8;
  uint local_3bac;
  long *local_3ba8;
  REAL weight;
  ulong local_3b98;
  long local_3b90;
  TPZGeoElSide thisGeoSide;
  TPZVec<double> centerPoint;
  REAL detjac;
  TPZGeoElSide largeGeoSide;
  TPZCompElSide largeCompSide;
  TPZManVector<double,_3> pointl;
  TPZManVector<double,_3> par;
  TPZGeoElSide local_3ab0;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<20,_double> blocknorm;
  TPZBlock MBlocklarge;
  TPZBlock MBlocksmall;
  TPZTransform<double> t;
  TPZStepSolver<double> MSolve;
  TPZFNMatrix<100,_double> thisTrace;
  TPZFNMatrix<100,_double> largeTrace;
  TPZFNMatrix<1000,_double> MSL;
  
  largeCompSide.fEl = (TPZCompEl *)large;
  largeCompSide.fSide = neighbourside;
  thisGeoSide.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
  thisGeoSide.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  thisGeoSide.fSide = side;
  TPZCompElSide::Reference(&largeGeoSide,&largeCompSide);
  iVar5 = TPZGeoElSide::Dimension(&thisGeoSide);
  iVar6 = TPZGeoElSide::Dimension(&largeGeoSide);
  if ((largeCompSide.fEl == (TPZCompEl *)0x0) ||
     (plVar11 = (long *)__dynamic_cast(largeCompSide.fEl,&TPZCompEl::typeinfo,
                                       &TPZInterpolatedElement::typeinfo,0), plVar11 == (long *)0x0)
     ) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - null computational element.");
    std::endl<char,std::char_traits<char>>(poVar13);
    return;
  }
  iVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  if (iVar7 < 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
               ,0x2a6);
  }
  lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0xa8))(this,iVar7);
  if (*(int *)(lVar12 + 0x18) == 0) {
    return;
  }
  if ((0 < iVar6) && (*(long *)(lVar12 + 0x20) != 0)) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "RestrainSide - unnecessary call to restrainside");
    std::endl<char,std::char_traits<char>>(poVar13);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
               ,0x2af);
  }
  uVar8 = (**(code **)(*plVar11 + 0x310))(plVar11,largeCompSide.fSide);
  lVar12 = (**(code **)(*plVar11 + 0xa0))(plVar11,uVar8);
  if (lVar12 == -1) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - Side of large element not initialized");
    std::endl<char,std::char_traits<char>>(poVar13);
    lineN = 0x2b3;
  }
  else {
    if (iVar6 != 0) {
      TPZTransform<double>::TPZTransform(&t,iVar5);
      local_3ab0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      local_3ab0.fGeoEl = largeGeoSide.fGeoEl;
      local_3ab0.fSide = largeGeoSide.fSide;
      TPZGeoElSide::SideTransform3(&thisGeoSide,&local_3ab0,&t);
      iVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x248))(this,side);
      connect = 0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar9 = 1;
      for (; iVar7 != connect; connect = connect + 1) {
        pTVar14 = TPZInterpolatedElement::SideConnect((TPZInterpolatedElement *)this,connect,side);
        bVar3 = (pTVar14->field_2).fCompose.fOrder;
        if (uVar9 <= bVar3) {
          uVar9 = (uint)bVar3;
        }
      }
      iVar7 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x338))
                        (large,neighbourside);
      lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0x318))(this,side);
      if ((iVar5 != 0) && ((int)(uint)*(byte *)(lVar12 + 0x14) < iVar7)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                   ,0x2c7);
      }
      pTVar15 = TPZCompEl::Reference((TPZCompEl *)this);
      plVar11 = (long *)(**(code **)(*(long *)pTVar15 + 0x70))(pTVar15,side,uVar9 * 2);
      if (plVar11 == (long *)0x0) {
        poVar13 = std::operator<<((ostream *)&std::cout,
                                  "Exiting RestrainSide - cannot create side integration rule");
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      else {
        local_3ba8 = plVar11;
        iVar7 = (**(code **)(*plVar11 + 0x18))();
        uVar9 = TPZInterpolatedElement::NSideShapeF((TPZInterpolatedElement *)this,side);
        uVar10 = TPZInterpolatedElement::NSideShapeF(large,neighbourside);
        lVar22 = (long)(int)uVar9;
        lVar12 = (long)(int)uVar10;
        blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
        TPZFNMatrix<1000,_double>::TPZFNMatrix(&MSL,lVar22,lVar12,(double *)&blocknorm);
        this_00 = (TPZFNMatrix<1000,_double> *)operator_new(0x1fd8);
        blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
        TPZFNMatrix<1000,_double>::TPZFNMatrix(this_00,lVar22,lVar22,(double *)&blocknorm);
        lVar26 = (long)iVar5;
        TPZManVector<double,_3>::TPZManVector(&par,lVar26);
        TPZManVector<double,_3>::TPZManVector(&pointl,(long)iVar6);
        blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
        TPZVec<double>::TPZVec(&centerPoint,lVar26,(double *)&blocknorm);
        TPZGeoElSide::CenterPoint(&thisGeoSide,&centerPoint);
        TPZFNMatrix<9,_double>::TPZFNMatrix(&jac,lVar26,lVar26);
        TPZFNMatrix<9,_double>::TPZFNMatrix(&jacinv,lVar26,lVar26);
        TPZFNMatrix<9,_double>::TPZFNMatrix(&axes,lVar26,3);
        TPZGeoElSide::Jacobian
                  (&thisGeoSide,&centerPoint,&jac.super_TPZFMatrix<double>,
                   &axes.super_TPZFMatrix<double>,&detjac,&jacinv.super_TPZFMatrix<double>);
        TPZFNMatrix<100,_double>::TPZFNMatrix((TPZFNMatrix<100,_double> *)&blocknorm,lVar22,3);
        TPZFNMatrix<100,_double>::TPZFNMatrix((TPZFNMatrix<100,_double> *)&MSolve,3,lVar22);
        TPZFNMatrix<100,_double>::TPZFNMatrix((TPZFNMatrix<100,_double> *)&MBlocksmall,lVar12,3);
        TPZFNMatrix<100,_double>::TPZFNMatrix((TPZFNMatrix<100,_double> *)&MBlocklarge,3,lVar12);
        TPZFNMatrix<100,_double>::TPZFNMatrix(&thisTrace,lVar22,3);
        TPZFNMatrix<100,_double>::TPZFNMatrix(&largeTrace,lVar12,3);
        uVar18 = 0;
        uVar23 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar23 = uVar18;
        }
        uVar16 = 0;
        if (0 < (int)uVar9) {
          uVar16 = (ulong)uVar9;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        while( true ) {
          if ((int)uVar18 == iVar7) break;
          (**(code **)(*local_3ba8 + 0x20))(local_3ba8,uVar18,&par,&weight);
          (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x288))(this,side,&par,&thisTrace,&MSolve);
          TPZTransform<double>::Apply(&t,&par.super_TPZVec<double>,&pointl.super_TPZVec<double>);
          (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                    (large,neighbourside,&pointl,&largeTrace,&MBlocklarge);
          for (uVar28 = 0; uVar28 != uVar16; uVar28 = uVar28 + 1) {
            for (uVar25 = 0; uVar25 != uVar9; uVar25 = uVar25 + 1) {
              local_3c28 = 0.0;
              for (lVar12 = 0; RVar4 = weight, lVar12 != 3; lVar12 = lVar12 + 1) {
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&thisTrace.super_TPZFMatrix<double>,uVar28,lVar12);
                dVar1 = *pdVar17;
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&thisTrace.super_TPZFMatrix<double>,uVar25,lVar12);
                local_3c28 = local_3c28 + dVar1 * *pdVar17;
              }
              pdVar17 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)this_00,uVar28,uVar25);
              *pdVar17 = local_3c28 * RVar4 + *pdVar17;
            }
            for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
              local_3c28 = 0.0;
              for (lVar12 = 0; RVar4 = weight, lVar12 != 3; lVar12 = lVar12 + 1) {
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&thisTrace.super_TPZFMatrix<double>,uVar28,lVar12);
                dVar1 = *pdVar17;
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&largeTrace.super_TPZFMatrix<double>,uVar25,lVar12);
                local_3c28 = local_3c28 + dVar1 * *pdVar17;
              }
              pdVar17 = TPZFMatrix<double>::operator()(&MSL.super_TPZFMatrix<double>,uVar28,uVar25);
              *pdVar17 = local_3c28 * RVar4 + *pdVar17;
            }
          }
          uVar18 = (ulong)((int)uVar18 + 1);
        }
        TPZFNMatrix<100,_double>::~TPZFNMatrix(&largeTrace);
        TPZFNMatrix<100,_double>::~TPZFNMatrix(&thisTrace);
        TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)&MBlocklarge);
        TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)&MBlocksmall);
        TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)&MSolve);
        TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)&blocknorm);
        TPZFNMatrix<9,_double>::~TPZFNMatrix(&axes);
        TPZFNMatrix<9,_double>::~TPZFNMatrix(&jacinv);
        TPZFNMatrix<9,_double>::~TPZFNMatrix(&jac);
        TPZVec<double>::~TPZVec(&centerPoint);
        TPZAutoPointer<TPZMatrix<double>>::TPZAutoPointer<TPZFNMatrix<1000,double>>
                  ((TPZAutoPointer<TPZMatrix<double>> *)&local_3bb8,this_00);
        TPZStepSolver<double>::TPZStepSolver(&MSolve,&local_3bb8);
        TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3bb8);
        TPZStepSolver<double>::SetDirect(&MSolve,ELU);
        TPZStepSolver<double>::Solve
                  (&MSolve,&MSL.super_TPZFMatrix<double>,&MSL.super_TPZFMatrix<double>,
                   (TPZFMatrix<double> *)0x0);
        uVar9 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x248))(this,side);
        uVar10 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x248
                             ))(large);
        TPZBlock::TPZBlock(&MBlocksmall,(TPZBaseMatrix *)0x0,uVar9,1);
        iVar5 = 0;
        TPZBlock::TPZBlock(&MBlocklarge,(TPZBaseMatrix *)0x0,uVar10,1);
        uVar23 = 0;
        if (0 < (int)uVar9) {
          uVar23 = (ulong)uVar9;
        }
        for (; (int)uVar23 != iVar5; iVar5 = iVar5 + 1) {
          uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x250))(this,iVar5,side);
          lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xa8))(this,uVar8);
          TPZBlock::Set(&MBlocksmall,iVar5,*(int *)(lVar12 + 0x18),-1);
        }
        b = 0;
        uVar24 = 0;
        if (0 < (int)uVar10) {
          uVar24 = uVar10;
        }
        for (; uVar24 != b; b = b + 1) {
          uVar8 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                              0x250))(large,b,neighbourside);
          lVar12 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                               0xa8))(large,uVar8);
          TPZBlock::Set(&MBlocklarge,b,*(int *)(lVar12 + 0x18),-1);
        }
        TPZBlock::Resequence(&MBlocksmall,0);
        TPZBlock::Resequence(&MBlocklarge,0);
        thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
        TPZFNMatrix<20,_double>::TPZFNMatrix
                  (&blocknorm,(long)(int)uVar9,(long)(int)uVar10,(double *)&thisTrace);
        uVar18 = (ulong)uVar24;
        local_3b98 = uVar23;
        for (uVar16 = 0; uVar16 != local_3b98; uVar16 = uVar16 + 1) {
          local_3b90 = uVar16 * 0x10;
          uVar10 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar16].dim;
          if (uVar10 != 0) {
            uVar23 = 0;
            if (0 < (int)uVar10) {
              uVar23 = (ulong)uVar10;
            }
            for (uVar28 = 0; uVar28 != uVar18; uVar28 = uVar28 + 1) {
              uVar24 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar28].dim;
              if (uVar24 != 0) {
                iVar5 = *(int *)((long)&(MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                        pos + local_3b90);
                iVar6 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar28].pos;
                uVar25 = 0;
                if (0 < (int)uVar24) {
                  uVar25 = (ulong)uVar24;
                }
                local_3bac = uVar24;
                for (uVar21 = 0; uVar21 != uVar23; uVar21 = uVar21 + 1) {
                  lVar12 = uVar21 + (long)iVar5;
                  lVar22 = (long)iVar6;
                  uVar27 = uVar25;
                  while (bVar29 = uVar27 != 0, uVar27 = uVar27 - 1, bVar29) {
                    pdVar17 = TPZFMatrix<double>::operator()
                                        (&MSL.super_TPZFMatrix<double>,lVar12,lVar22);
                    dVar1 = *pdVar17;
                    pdVar17 = TPZFMatrix<double>::operator()
                                        (&MSL.super_TPZFMatrix<double>,lVar12,lVar22);
                    dVar2 = *pdVar17;
                    pdVar17 = TPZFMatrix<double>::operator()
                                        (&blocknorm.super_TPZFMatrix<double>,uVar16,uVar28);
                    *pdVar17 = ABS(dVar2) * ABS(dVar1) + *pdVar17;
                    lVar22 = lVar22 + 1;
                  }
                }
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&blocknorm.super_TPZFMatrix<double>,uVar16,uVar28);
                *pdVar17 = *pdVar17 / (double)(int)(local_3bac * uVar10);
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&blocknorm.super_TPZFMatrix<double>,uVar16,uVar28);
                dVar1 = *pdVar17;
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
                pdVar17 = TPZFMatrix<double>::operator()
                                    (&blocknorm.super_TPZFMatrix<double>,uVar16,uVar28);
                *pdVar17 = dVar1;
              }
            }
          }
        }
        uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x310))(this,side);
        pTVar14 = (TPZConnect *)
                  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0xa8))(this,uVar8);
        uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x310))(this,side);
        myindex = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0xa0))(this,uVar8);
        lVar26 = (long)(int)(uVar9 - 1);
        lVar12 = 0xc;
        lVar22 = 0;
        for (uVar23 = 0; plVar11 = local_3ba8, uVar18 != uVar23; uVar23 = uVar23 + 1) {
          if ((MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar26].dim != 0) &&
             (*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                              super_TPZSavable)._vptr_TPZSavable + lVar12) != 0)) {
            iVar19 = TPZInterpolatedElement::SideConnectIndex(large,(int)uVar23,neighbourside);
            pTVar20 = TPZConnect::AddDependency
                                (pTVar14,myindex,iVar19,&MSL.super_TPZFMatrix<double>,
                                 (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                                       [lVar26].pos,
                                 (long)*(int *)((long)MBlocklarge.fBlock.
                                                      super_TPZVec<TPZBlock::TNode>.fStore +
                                               lVar12 + -4),
                                 MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar26].dim
                                 ,*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>
                                                   .fStore)->super_TPZSavable)._vptr_TPZSavable +
                                          lVar12));
            pdVar17 = TPZFMatrix<double>::operator()
                                (&blocknorm.super_TPZFMatrix<double>,lVar26,uVar23);
            if (*pdVar17 <= 1e-08 && *pdVar17 != 1e-08) {
              memset((pTVar20->fDepMatrix).super_TPZFMatrix<double>.fElem,0,
                     (pTVar20->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow *
                     (pTVar20->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fCol * 8);
              (pTVar20->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fDecomposed = '\0';
            }
            lVar22 = lVar22 + 1;
          }
          lVar12 = lVar12 + 0x10;
        }
        if (lVar22 == 0) {
          lVar12 = 0xc;
          for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
            iVar19 = TPZInterpolatedElement::SideConnectIndex(large,(int)uVar23,neighbourside);
            iVar5 = *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                    super_TPZSavable)._vptr_TPZSavable + lVar12);
            if (iVar5 != 0) {
              TPZConnect::AddDependency
                        (pTVar14,myindex,iVar19,&MSL.super_TPZFMatrix<double>,
                         (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar26].pos,
                         (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                              fStore + lVar12 + -4),
                         MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar26].dim,iVar5);
            }
            lVar12 = lVar12 + 0x10;
          }
        }
        (**(code **)(*plVar11 + 8))(plVar11);
        TPZFNMatrix<20,_double>::~TPZFNMatrix(&blocknorm);
        TPZBlock::~TPZBlock(&MBlocklarge);
        TPZBlock::~TPZBlock(&MBlocksmall);
        TPZStepSolver<double>::~TPZStepSolver(&MSolve);
        TPZManVector<double,_3>::~TPZManVector(&pointl);
        TPZManVector<double,_3>::~TPZManVector(&par);
        TPZFNMatrix<1000,_double>::~TPZFNMatrix(&MSL);
      }
      TPZTransform<double>::~TPZTransform(&t);
      return;
    }
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - dimension of large element is 0");
    std::endl<char,std::char_traits<char>>(poVar13);
    lineN = 0x2b8;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
             ,lineN);
}

Assistant:

void TPZCompElHCurl<TSHAPE>::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    const TPZCompElSide thisCompSide(this, side);
    const TPZCompElSide largeCompSide(large, neighbourside);
    TPZGeoElSide thisGeoSide(this->Reference(), side);
    const TPZGeoElSide largeGeoSide = largeCompSide.Reference();
    const auto thisSideDimension = thisGeoSide.Dimension();
    const auto largeSideDimension = largeGeoSide.Dimension();


    TPZInterpolatedElement *largeCel = nullptr;
    if (largeCompSide.Exists()) largeCel = dynamic_cast<TPZInterpolatedElement *> (largeCompSide.Element());
    if (!largeCel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    const auto connectLocId = this->MidSideConnectLocId(side);
    if (connectLocId < 0) {
        DebugStop();
    }
    const TPZConnect &myConnect = this->Connect(connectLocId);
    if (myConnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myConnect.HasDependency() && largeSideDimension > 0) {
        LOGPZ_ERROR(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (largeCel->ConnectIndex(largeCel->MidSideConnectLocId(largeCompSide.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largeSideDimension == 0) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - dimension of large element is 0");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisSideDimension);
    thisGeoSide.SideTransform3(largeGeoSide, t);
    const auto nSideConnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nSideConnects; sidecon++) {
        TPZConnect &c = this->SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    const auto largeOrder = large->EffectiveSideOrder(neighbourside);
    const auto sideOrder = this->MidSideConnect(side).Order();
    if (sideOrder < largeOrder && thisSideDimension && largeSideDimension) {
        DebugStop();
    }
    TPZIntPoints *intrule = this->Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    const auto numint = intrule->NPoints();
    const auto numshape = this->NSideShapeF(side);
    const auto numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(thisSideDimension), pointl(largeSideDimension);

    {
        REAL detjac;
        TPZVec<REAL> centerPoint(thisSideDimension,0);
        thisGeoSide.CenterPoint(centerPoint);
        TPZFNMatrix<9,REAL> jac(thisSideDimension,thisSideDimension),jacinv(thisSideDimension,thisSideDimension),axes(thisSideDimension,3);
        thisGeoSide.Jacobian(centerPoint, jac, axes, detjac, jacinv);
        REAL weight;
        TPZFNMatrix<100, REAL> phis(numshape, 3), dphis(3, numshape), phil(numshapel, 3), dphil(3, numshapel);
        TPZFNMatrix<100, REAL> thisTrace(numshape, 3), largeTrace(numshapel, 3);
        for (int it = 0; it < numint; it++) {
            intrule->Point(it, par, weight);
            SideShapeFunction(side, par, thisTrace, dphis);
            t.Apply(par, pointl);
            large->SideShapeFunction(neighbourside, pointl, largeTrace, dphil);
            for (auto in = 0; in < numshape; in++) {
                for (auto jn = 0; jn < numshape; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * thisTrace(jn,iaxes);
                    }
                    (*M)(in, jn) += dotProduct * weight;
                }
                for (auto jn = 0; jn < numshapel; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * largeTrace(jn,iaxes);
                    }
                    MSL(in, jn) += dotProduct * weight;
                }
            }
        }
    }

#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    const auto thisNumSideNodes = NSideConnects(side);
    const auto largeNumSideNodes = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, thisNumSideNodes), MBlocklarge(0, largeNumSideNodes);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = this->Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (auto in = 0; in < largeNumSideNodes; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(thisNumSideNodes, largeNumSideNodes, 0.);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    this->CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = this->Connect(this->MidSideConnectLocId(side));
    const auto inodindex = ConnectIndex(this->MidSideConnectLocId(side));
    int64_t ndepend = 0;
    const auto in = thisNumSideNodes - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (auto jn = 0; jn < largeNumSideNodes; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                                           MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                   MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // restraint matrix should be equal to MSL
    {
        TPZCheckRestraint test(thisCompSide, largeCompSide);
        int64_t imsl, jmsl;
        const int64_t rmsl = MSL.Rows();
        const int64_t cmsl = MSL.Cols();
        const int64_t rtest = test.RestraintMatrix().Rows();
        const int64_t ctest = test.RestraintMatrix().Cols();

        if (rtest != rmsl || ctest != cmsl) {
            std::stringstream sout;
            sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                 << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n";
            LOGPZ_ERROR(logger, sout.str())
            return;
        }

        TPZFMatrix<REAL> mslc(MSL);
        mslc -= test.RestraintMatrix();

        REAL normmsl = 0.;
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
            }
        }
        if (normmsl > 1.E-6) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
            mslc.Print("Difference Matrix ", sout);
            for (imsl = 0; imsl < rmsl; imsl++) {
                for (jmsl = 0; jmsl < cmsl; jmsl++) {
                    if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                        sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                             << test.RestraintMatrix()(imsl, jmsl) << std::endl;
                    }
                }
            }
            LOGPZ_ERROR(logger, sout.str())
        }

        if (test.CheckRestraint()) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::Bad restraints detected\n";
            test.Print(sout);
            test.Diagnose();
            LOGPZ_ERROR(logger, sout.str())
        }
    }
#endif
}